

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void * luaL_checkudata(lua_State *L,int ud,char *tname)

{
  int iVar1;
  TValue *pTVar2;
  GCObject *pGVar3;
  
  pTVar2 = &luaO_nilobject_;
  if (L->base < L->top) {
    pTVar2 = L->base;
  }
  if (pTVar2->tt == 2) {
    pGVar3 = (pTVar2->value).gc;
    if (pGVar3 == (GCObject *)0x0) goto LAB_00111710;
  }
  else {
    if (pTVar2->tt != 7) goto LAB_00111710;
    pGVar3 = (GCObject *)&(((pTVar2->value).gc)->h).lastfree;
  }
  iVar1 = lua_getmetatable(L,ud);
  if (iVar1 != 0) {
    lua_getfield(L,-10000,"FILE*");
    iVar1 = lua_rawequal(L,-1,-2);
    if (iVar1 != 0) {
      L->top = L->top + -2;
      return pGVar3;
    }
  }
LAB_00111710:
  luaL_typerror(L,1,"FILE*");
}

Assistant:

static void*luaL_checkudata(lua_State*L,int ud,const char*tname){
void*p=lua_touserdata(L,ud);
if(p!=NULL){
if(lua_getmetatable(L,ud)){
lua_getfield(L,(-10000),tname);
if(lua_rawequal(L,-1,-2)){
lua_pop(L,2);
return p;
}
}
}
luaL_typerror(L,ud,tname);
return NULL;
}